

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlAttrNormalizeSpace(xmlChar *src,xmlChar *dst)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  
  pbVar3 = src + -1;
  do {
    pbVar1 = pbVar3 + 1;
    pbVar3 = pbVar3 + 1;
  } while (*pbVar1 == 0x20);
LAB_0013873d:
  bVar2 = *pbVar3;
  if (bVar2 == 0x20) goto LAB_0013872a;
  if (bVar2 == 0) {
    *dst = 0;
    return (xmlChar *)(ulong)bVar2;
  }
  pbVar3 = pbVar3 + 1;
  goto LAB_00138738;
LAB_0013872a:
  for (; *pbVar3 == 0x20; pbVar3 = pbVar3 + 1) {
  }
  if (*pbVar3 != 0) {
    bVar2 = 0x20;
LAB_00138738:
    *dst = bVar2;
    dst = dst + 1;
  }
  goto LAB_0013873d;
}

Assistant:

static xmlChar *
xmlAttrNormalizeSpace(const xmlChar *src, xmlChar *dst)
{
    if ((src == NULL) || (dst == NULL))
        return(NULL);

    while (*src == 0x20) src++;
    while (*src != 0) {
	if (*src == 0x20) {
	    while (*src == 0x20) src++;
	    if (*src != 0)
		*dst++ = 0x20;
	} else {
	    *dst++ = *src++;
	}
    }
    *dst = 0;
    if (dst == src)
       return(NULL);
    return(dst);
}